

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

int llvm::
    array_pod_sort_comparator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>
              (void *P1,void *P2)

{
  bool bVar1;
  less<BucketInfo> local_22;
  less<BucketInfo> local_21;
  BucketInfo *local_20;
  void *P2_local;
  void *P1_local;
  
  local_20 = (BucketInfo *)P2;
  P2_local = P1;
  bVar1 = std::less<BucketInfo>::operator()(&local_21,(BucketInfo *)P1,(BucketInfo *)P2);
  if (bVar1) {
    P1_local._4_4_ = -1;
  }
  else {
    bVar1 = std::less<BucketInfo>::operator()(&local_22,local_20,(BucketInfo *)P2_local);
    if (bVar1) {
      P1_local._4_4_ = 1;
    }
    else {
      P1_local._4_4_ = 0;
    }
  }
  return P1_local._4_4_;
}

Assistant:

inline int array_pod_sort_comparator(const void *P1, const void *P2) {
  if (std::less<T>()(*reinterpret_cast<const T*>(P1),
                     *reinterpret_cast<const T*>(P2)))
    return -1;
  if (std::less<T>()(*reinterpret_cast<const T*>(P2),
                     *reinterpret_cast<const T*>(P1)))
    return 1;
  return 0;
}